

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::PixelBufferAccess::setPixel(PixelBufferAccess *this,IVec4 *color,int x,int y,int z)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  uint *ptr;
  deUint32 *pdVar7;
  TextureSwizzle *pTVar8;
  int *piVar9;
  int local_b8;
  int c;
  int channelSize;
  Channel *map;
  undefined1 local_a0 [4];
  int numChannels;
  IVec4 swizzled_6;
  IVec4 swizzled_5;
  IVec4 swizzled_4;
  IVec4 swizzled_3;
  IVec4 swizzled_2;
  IVec4 swizzled_1;
  IVec4 swizzled;
  deUint8 *pixelPtr;
  int z_local;
  int y_local;
  int x_local;
  IVec4 *color_local;
  PixelBufferAccess *this_local;
  
  ptr = (uint *)getPixelPtr(this,x,y,z);
  if ((this->super_ConstPixelBufferAccess).m_format.type == UNORM_INT8) {
    if (((this->super_ConstPixelBufferAccess).m_format.order == RGBA) ||
       ((this->super_ConstPixelBufferAccess).m_format.order == sRGBA)) {
      anon_unknown_75::writeRGBA8888Int((deUint8 *)ptr,color);
      return;
    }
    if (((this->super_ConstPixelBufferAccess).m_format.order == RGB) ||
       ((this->super_ConstPixelBufferAccess).m_format.order == sRGB)) {
      anon_unknown_75::writeRGB888Int((deUint8 *)ptr,color);
      return;
    }
  }
  switch((this->super_ConstPixelBufferAccess).m_format.type) {
  case UNORM_BYTE_44:
  case UNSIGNED_BYTE_44:
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[](color,0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,4);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[](color,1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,4);
    *(byte *)ptr = (byte)(dVar1 << 4) | (byte)dVar2;
    break;
  case UNORM_SHORT_565:
  case UNSIGNED_SHORT_565:
    swizzleRB<int>((tcu *)(swizzled_1.m_data + 2),color,RGB,
                   (this->super_ConstPixelBufferAccess).m_format.order);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_1.m_data + 2),0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_1.m_data + 2),1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,6);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_1.m_data + 2),2);
    dVar3 = anon_unknown_75::uintToChannel(*pdVar7,5);
    *(ushort *)ptr = (ushort)(dVar1 << 0xb) | (ushort)(dVar2 << 5) | (ushort)dVar3;
    break;
  case UNORM_SHORT_555:
    swizzleRB<int>((tcu *)(swizzled_2.m_data + 2),color,RGB,
                   (this->super_ConstPixelBufferAccess).m_format.order);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_2.m_data + 2),0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_2.m_data + 2),1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_2.m_data + 2),2);
    dVar3 = anon_unknown_75::uintToChannel(*pdVar7,5);
    *(ushort *)ptr = (ushort)(dVar1 << 10) | (ushort)(dVar2 << 5) | (ushort)dVar3;
    break;
  case UNORM_SHORT_4444:
  case UNSIGNED_SHORT_4444:
    swizzleRB<int>((tcu *)(swizzled_3.m_data + 2),color,RGBA,
                   (this->super_ConstPixelBufferAccess).m_format.order);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_3.m_data + 2),0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,4);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_3.m_data + 2),1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,4);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_3.m_data + 2),2);
    dVar3 = anon_unknown_75::uintToChannel(*pdVar7,4);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_3.m_data + 2),3);
    dVar4 = anon_unknown_75::uintToChannel(*pdVar7,4);
    *(ushort *)ptr =
         (ushort)(dVar1 << 0xc) | (ushort)(dVar2 << 8) | (ushort)(dVar3 << 4) | (ushort)dVar4;
    break;
  case UNORM_SHORT_5551:
  case UNSIGNED_SHORT_5551:
    swizzleRB<int>((tcu *)(swizzled_4.m_data + 2),color,RGBA,
                   (this->super_ConstPixelBufferAccess).m_format.order);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_4.m_data + 2),0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_4.m_data + 2),1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_4.m_data + 2),2);
    dVar3 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_4.m_data + 2),3);
    dVar4 = anon_unknown_75::uintToChannel(*pdVar7,1);
    *(ushort *)ptr =
         (ushort)(dVar1 << 0xb) | (ushort)(dVar2 << 6) | (ushort)(dVar3 << 1) | (ushort)dVar4;
    break;
  case UNORM_SHORT_1555:
    Vector<int,_4>::swizzle((Vector<int,_4> *)(swizzled_5.m_data + 2),(int)color,3,0,1);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_5.m_data + 2),0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,1);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_5.m_data + 2),1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_5.m_data + 2),2);
    dVar3 = anon_unknown_75::uintToChannel(*pdVar7,5);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_5.m_data + 2),3);
    dVar4 = anon_unknown_75::uintToChannel(*pdVar7,5);
    *(ushort *)ptr =
         (ushort)(dVar1 << 0xf) | (ushort)(dVar2 << 10) | (ushort)(dVar3 << 5) | (ushort)dVar4;
    break;
  case UNORM_INT_101010:
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[](color,0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,10);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[](color,1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,10);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[](color,2);
    dVar3 = anon_unknown_75::uintToChannel(*pdVar7,10);
    *ptr = dVar1 << 0x16 | dVar2 << 0xc | dVar3 << 2;
    break;
  case SNORM_INT_1010102_REV:
  case SIGNED_INT_1010102_REV:
    swizzleRB<int>((tcu *)local_a0,color,RGBA,(this->super_ConstPixelBufferAccess).m_format.order);
    piVar9 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_a0,0);
    dVar1 = anon_unknown_75::intToChannel(*piVar9,10);
    piVar9 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_a0,1);
    dVar2 = anon_unknown_75::intToChannel(*piVar9,10);
    piVar9 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_a0,2);
    dVar3 = anon_unknown_75::intToChannel(*piVar9,10);
    piVar9 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_a0,3);
    dVar4 = anon_unknown_75::intToChannel(*piVar9,2);
    *ptr = dVar1 | dVar2 << 10 | dVar3 << 0x14 | dVar4 << 0x1e;
    break;
  case UNORM_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
    swizzleRB<int>((tcu *)(swizzled_6.m_data + 2),color,RGBA,
                   (this->super_ConstPixelBufferAccess).m_format.order);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_6.m_data + 2),0);
    dVar1 = anon_unknown_75::uintToChannel(*pdVar7,10);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_6.m_data + 2),1);
    dVar2 = anon_unknown_75::uintToChannel(*pdVar7,10);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_6.m_data + 2),2);
    dVar3 = anon_unknown_75::uintToChannel(*pdVar7,10);
    pdVar7 = (deUint32 *)Vector<int,_4>::operator[]((Vector<int,_4> *)(swizzled_6.m_data + 2),3);
    dVar4 = anon_unknown_75::uintToChannel(*pdVar7,2);
    *ptr = dVar1 | dVar2 << 10 | dVar3 << 0x14 | dVar4 << 0x1e;
    break;
  default:
    iVar5 = getNumUsedChannels((this->super_ConstPixelBufferAccess).m_format.order);
    pTVar8 = getChannelWriteSwizzle((this->super_ConstPixelBufferAccess).m_format.order);
    iVar6 = getChannelSize((this->super_ConstPixelBufferAccess).m_format.type);
    for (local_b8 = 0; local_b8 < iVar5; local_b8 = local_b8 + 1) {
      piVar9 = Vector<int,_4>::operator[](color,pTVar8->components[local_b8]);
      anon_unknown_75::intToChannel
                ((byte *)((long)ptr + (long)(iVar6 * local_b8)),*piVar9,
                 (this->super_ConstPixelBufferAccess).m_format.type);
    }
  }
  return;
}

Assistant:

void PixelBufferAccess::setPixel (const IVec4& color, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
		{
			writeRGBA8888Int(pixelPtr, color);
			return;
		}
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
		{
			writeRGB888Int(pixelPtr, color);
			return;
		}
	}

#define PU(VAL, OFFS, BITS)		(uintToChannel((deUint32)(VAL), (BITS)) << (OFFS))
#define PI(VAL, OFFS, BITS)		(intToChannel((deUint32)(VAL), (BITS)) << (OFFS))

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_BYTE_44:	// Fall-through
		case TextureFormat::UNORM_BYTE_44:		*((deUint8 *)pixelPtr) = (deUint8 )(PU(color[0],  4, 4) | PU(color[1], 0, 4));				break;
		case TextureFormat::UNORM_INT_101010:	*((deUint32*)pixelPtr) = PU(color[0], 22, 10) | PU(color[1], 12, 10) | PU(color[2], 2, 10);	break;

		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNSIGNED_SHORT_565:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 5, 6) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_555:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGB, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 10, 5) | PU(swizzled[1], 5, 5) | PU(swizzled[2], 0, 5));
			break;
		}

		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNSIGNED_SHORT_4444:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 12, 4) | PU(swizzled[1], 8, 4) | PU(swizzled[2], 4, 4) | PU(swizzled[3], 0, 4));
			break;
		}

		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNSIGNED_SHORT_5551:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 11, 5) | PU(swizzled[1], 6, 5) | PU(swizzled[2], 1, 5) | PU(swizzled[3], 0, 1));
			break;
		}

		case TextureFormat::UNORM_SHORT_1555:
		{
			const IVec4 swizzled = color.swizzle(3,0,1,2); // RGBA -> ARGB
			*((deUint16*)pixelPtr) = (deUint16)(PU(swizzled[0], 15, 1) | PU(swizzled[1], 10, 5) | PU(swizzled[2], 5, 5) | PU(swizzled[3], 0, 5));
			break;
		}

		case TextureFormat::UNORM_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PU(swizzled[0],  0, 10) | PU(swizzled[1], 10, 10) | PU(swizzled[2], 20, 10) | PU(swizzled[3], 30, 2);
			break;
		}

		case TextureFormat::SNORM_INT_1010102_REV:
		case TextureFormat::SIGNED_INT_1010102_REV:
		{
			const IVec4 swizzled = swizzleRB(color, TextureFormat::RGBA, m_format.order);
			*((deUint32*)pixelPtr) = PI(swizzled[0],  0, 10) | PI(swizzled[1], 10, 10) | PI(swizzled[2], 20, 10) | PI(swizzled[3], 30, 2);
			break;
		}

		default:
		{
			// Generic path.
			int								numChannels	= getNumUsedChannels(m_format.order);
			const TextureSwizzle::Channel*	map			= getChannelWriteSwizzle(m_format.order).components;
			int								channelSize	= getChannelSize(m_format.type);

			for (int c = 0; c < numChannels; c++)
			{
				DE_ASSERT(deInRange32(map[c], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3));
				intToChannel(pixelPtr + channelSize*c, color[map[c]], m_format.type);
			}
			break;
		}
	}

#undef PU
#undef PI
}